

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

string * anon_unknown.dwarf_ec6a::cpputf8_u32_to_u8(string *__return_storage_ptr__,u32string *u32)

{
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  start;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  start._M_current = (u32->_M_dataplus)._M_p;
  utf8::
  utf32to8<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
            (start,(__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                    )(start._M_current + u32->_M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline
string cpputf8_u32_to_u8(const u32string& u32)
{
    string u8;
    utf8::utf32to8(std::begin(u32), std::end(u32), std::back_inserter(u8));
    return u8;
}